

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::GaussianNoise::backward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  uint uVar13;
  Index size;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar14;
  
  uVar14 = (ulong)(dEdf->d).nd;
  iVar12 = 1;
  iVar15 = 1;
  if (uVar14 != 0) {
    uVar16 = 0;
    do {
      iVar15 = iVar15 * (dEdf->d).d[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  uVar14 = (ulong)(dEdxi->d).nd;
  if (uVar14 != 0) {
    iVar12 = 1;
    uVar16 = 0;
    do {
      iVar12 = iVar12 * (dEdxi->d).d[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  uVar13 = iVar12 * (dEdxi->d).bd;
  uVar14 = (ulong)uVar13;
  if (uVar13 == iVar15 * (dEdf->d).bd) {
    pfVar4 = dEdxi->v;
    uVar16 = uVar14;
    if ((((ulong)pfVar4 & 3) == 0) &&
       (uVar16 = (ulong)(-((uint)((ulong)pfVar4 >> 2) & 0x3fffffff) & 3), uVar14 <= uVar16)) {
      uVar16 = uVar14;
    }
    pfVar5 = dEdf->v;
    uVar18 = uVar14 - uVar16;
    uVar17 = uVar18 + 3;
    if (-1 < (long)uVar18) {
      uVar17 = uVar18;
    }
    if (uVar16 != 0) {
      uVar19 = 0;
      do {
        pfVar4[uVar19] = pfVar5[uVar19] + pfVar4[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    uVar17 = (uVar17 & 0xfffffffffffffffc) + uVar16;
    if (3 < (long)uVar18) {
      do {
        pfVar1 = pfVar5 + uVar16;
        fVar6 = pfVar1[1];
        fVar7 = pfVar1[2];
        fVar8 = pfVar1[3];
        pfVar2 = pfVar4 + uVar16;
        fVar9 = pfVar2[1];
        fVar10 = pfVar2[2];
        fVar11 = pfVar2[3];
        pfVar3 = pfVar4 + uVar16;
        *pfVar3 = *pfVar1 + *pfVar2;
        pfVar3[1] = fVar6 + fVar9;
        pfVar3[2] = fVar7 + fVar10;
        pfVar3[3] = fVar8 + fVar11;
        uVar16 = uVar16 + 4;
      } while ((long)uVar16 < (long)uVar17);
    }
    if ((long)uVar17 < (long)uVar14) {
      do {
        pfVar4[uVar17] = pfVar5[uVar17] + pfVar4[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
    }
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Functor = Eigen::internal::add_assign_op<float, float>]"
               );
}

Assistant:

void GaussianNoise::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  dEdxi.vec() += dEdf.vec();
#endif
}